

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

bool __thiscall FIX::DataDictionary::isMultipleValueField(DataDictionary *this,int field)

{
  bool bVar1;
  pointer ppVar2;
  bool local_39;
  bool local_29;
  _Self local_28;
  _Self local_20;
  const_iterator i;
  int field_local;
  DataDictionary *this_local;
  
  i._M_node._4_4_ = field;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::TYPE::Type,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
       ::find((map<int,_FIX::TYPE::Type,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
               *)(this + 0x1c8),(key_type *)((long)&i._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::TYPE::Type,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
       ::end((map<int,_FIX::TYPE::Type,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
              *)(this + 0x1c8));
  bVar1 = std::operator!=(&local_20,&local_28);
  local_29 = false;
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_FIX::TYPE::Type>_>::operator->
                       (&local_20);
    local_39 = true;
    if (ppVar2->second != MultipleValueString) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_FIX::TYPE::Type>_>::operator->
                         (&local_20);
      local_39 = true;
      if (ppVar2->second != MultipleCharValue) {
        ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_FIX::TYPE::Type>_>::operator->
                           (&local_20);
        local_39 = ppVar2->second == MultipleStringValue;
      }
    }
    local_29 = local_39;
  }
  return local_29;
}

Assistant:

bool isMultipleValueField( int field ) const
  {
    FieldTypes::const_iterator i = m_fieldTypes.find( field );
    return i != m_fieldTypes.end() 
      && (i->second == TYPE::MultipleValueString 
          || i->second == TYPE::MultipleCharValue 
          || i->second == TYPE::MultipleStringValue );
  }